

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerGLSL::args_will_forward
          (CompilerGLSL *this,uint32_t id,uint32_t *args,uint32_t num_args,bool pure)

{
  bool bVar1;
  SmallVector<unsigned_int,_8UL> *pSVar2;
  uint *puVar3;
  uint aliased;
  uint *__end2_1;
  uint *__begin2_1;
  SmallVector<unsigned_int,_8UL> *__range2_1;
  uint global;
  uint *__end2;
  uint *__begin2;
  SmallVector<unsigned_int,_8UL> *__range2;
  _Node_iterator_base<unsigned_int,_false> _Stack_40;
  uint32_t i;
  _Node_iterator_base<unsigned_int,_false> local_38;
  byte local_2d;
  uint32_t local_2c;
  bool pure_local;
  uint32_t *puStack_28;
  uint32_t num_args_local;
  uint32_t *args_local;
  CompilerGLSL *pCStack_18;
  uint32_t id_local;
  CompilerGLSL *this_local;
  
  local_2d = pure;
  local_2c = num_args;
  puStack_28 = args;
  args_local._4_4_ = id;
  pCStack_18 = this;
  local_38._M_cur =
       (__node_type *)
       ::std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::find(&(this->super_Compiler).forced_temporaries,(key_type *)((long)&args_local + 4));
  _Stack_40._M_cur =
       (__node_type *)
       ::std::
       end<std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>>
                 (&(this->super_Compiler).forced_temporaries);
  bVar1 = ::std::__detail::operator!=(&local_38,&stack0xffffffffffffffc0);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    for (__range2._4_4_ = 0; __range2._4_4_ < local_2c; __range2._4_4_ = __range2._4_4_ + 1) {
      bVar1 = should_forward(this,puStack_28[__range2._4_4_]);
      if (!bVar1) {
        return false;
      }
    }
    if ((local_2d & 1) == 0) {
      pSVar2 = &(this->super_Compiler).global_variables;
      __end2 = VectorView<unsigned_int>::begin(&pSVar2->super_VectorView<unsigned_int>);
      puVar3 = VectorView<unsigned_int>::end(&pSVar2->super_VectorView<unsigned_int>);
      for (; __end2 != puVar3; __end2 = __end2 + 1) {
        bVar1 = should_forward(this,*__end2);
        if (!bVar1) {
          return false;
        }
      }
      pSVar2 = &(this->super_Compiler).aliased_variables;
      __end2_1 = VectorView<unsigned_int>::begin(&pSVar2->super_VectorView<unsigned_int>);
      puVar3 = VectorView<unsigned_int>::end(&pSVar2->super_VectorView<unsigned_int>);
      for (; __end2_1 != puVar3; __end2_1 = __end2_1 + 1) {
        bVar1 = should_forward(this,*__end2_1);
        if (!bVar1) {
          return false;
        }
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool CompilerGLSL::args_will_forward(uint32_t id, const uint32_t *args, uint32_t num_args, bool pure)
{
	if (forced_temporaries.find(id) != end(forced_temporaries))
		return false;

	for (uint32_t i = 0; i < num_args; i++)
		if (!should_forward(args[i]))
			return false;

	// We need to forward globals as well.
	if (!pure)
	{
		for (auto global : global_variables)
			if (!should_forward(global))
				return false;
		for (auto aliased : aliased_variables)
			if (!should_forward(aliased))
				return false;
	}

	return true;
}